

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback-queue.cc
# Opt level: O2

void __thiscall
capture_thread::testing::CallbackQueue::Push(CallbackQueue *this,function<void_()> *callback)

{
  std::mutex::lock(&this->queue_lock_);
  if (this->terminated_ == false) {
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,
               callback);
    std::condition_variable::notify_all();
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void CallbackQueue::Push(std::function<void()> callback) {
  std::lock_guard<std::mutex> lock(queue_lock_);
  if (!terminated_) {
    queue_.push(std::move(callback));
    condition_.notify_all();
  }
}